

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O1

void __thiscall
amrex::DeriveList::add
          (DeriveList *this,string *name,IndexType result_type,int nvar_der,DeriveBoxMap box_map)

{
  size_t *psVar1;
  pointer pcVar2;
  _Node *p_Var3;
  DeriveRec local_d0;
  
  local_d0.derive_name._M_dataplus._M_p = (pointer)&local_d0.derive_name.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + name->_M_string_length);
  local_d0.variable_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.variable_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.variable_names.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.func = (DeriveFunc)0x0;
  local_d0.func_3d = (DeriveFunc3D)0x0;
  local_d0.func_fab.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_d0.func_fab.super__Function_base._M_functor._8_8_ = 0;
  local_d0.func_fab.super__Function_base._M_manager = (_Manager_type)0x0;
  local_d0.func_fab._M_invoker = (_Invoker_type)0x0;
  local_d0.mapper = (Interpolater *)0x0;
  local_d0.n_state = 0;
  local_d0.nsr = 0;
  local_d0.rng = (StateRange *)0x0;
  local_d0.bcr = (int *)0x0;
  local_d0.bcr3D = (int *)0x0;
  local_d0.der_type.itype = result_type.itype;
  local_d0.n_derive = nvar_der;
  local_d0.bx_map = box_map;
  p_Var3 = std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::
           _M_create_node<amrex::DeriveRec>(&this->lst,&local_d0);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = &(this->lst).super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  DeriveRec::~DeriveRec(&local_d0);
  return;
}

Assistant:

void
DeriveList::add (const std::string&      name,
                 IndexType               result_type,
                 int                     nvar_der,
                 DeriveRec::DeriveBoxMap box_map)
{
    lst.push_back(DeriveRec(name,result_type,nvar_der,box_map));
}